

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::AesGcmV1::printTo(AesGcmV1 *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  string sStack_38;
  
  std::operator<<(out,"AesGcmV1(");
  std::operator<<(out,"aad_prefix=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(&sStack_38,(thrift *)&this->aad_prefix,t)
    ;
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"aad_file_unique=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&sStack_38,(thrift *)&this->aad_file_unique,t_00);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"supply_aad_prefix=");
  if (((byte)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&sStack_38,&this->supply_aad_prefix);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void AesGcmV1::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "AesGcmV1(";
  out << "aad_prefix="; (__isset.aad_prefix ? (out << to_string(aad_prefix)) : (out << "<null>"));
  out << ", " << "aad_file_unique="; (__isset.aad_file_unique ? (out << to_string(aad_file_unique)) : (out << "<null>"));
  out << ", " << "supply_aad_prefix="; (__isset.supply_aad_prefix ? (out << to_string(supply_aad_prefix)) : (out << "<null>"));
  out << ")";
}